

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

int mime_part_rewind(curl_mimepart *part)

{
  mimestate mVar1;
  int iVar2;
  int iVar3;
  mimestate mVar4;
  
  mVar1 = (part->state).state;
  mVar4 = part->flags * 2 & MIMESTATE_BODY;
  (part->encstate).pos = 0;
  (part->encstate).bufbeg = 0;
  (part->encstate).bufend = 0;
  iVar3 = 0;
  if (mVar4 < mVar1) {
    if (part->seekfunc == (curl_seek_callback)0x0) {
      iVar3 = 2;
    }
    else {
      iVar2 = (*part->seekfunc)(part->arg,0,0);
      iVar3 = 1;
      if (iVar2 + 1U < 4) {
        iVar3 = *(int *)(&DAT_0056fc00 + (ulong)(iVar2 + 1U) * 4);
      }
    }
  }
  if (iVar3 == 0) {
    (part->state).state = mVar4;
    (part->state).ptr = (void *)0x0;
    (part->state).offset = 0;
  }
  return iVar3;
}

Assistant:

static int mime_part_rewind(curl_mimepart *part)
{
  int res = CURL_SEEKFUNC_OK;
  enum mimestate targetstate = MIMESTATE_BEGIN;

  if(part->flags & MIME_BODY_ONLY)
    targetstate = MIMESTATE_BODY;
  cleanup_encoder_state(&part->encstate);
  if(part->state.state > targetstate) {
    res = CURL_SEEKFUNC_CANTSEEK;
    if(part->seekfunc) {
      res = part->seekfunc(part->arg, (curl_off_t) 0, SEEK_SET);
      switch(res) {
      case CURL_SEEKFUNC_OK:
      case CURL_SEEKFUNC_FAIL:
      case CURL_SEEKFUNC_CANTSEEK:
        break;
      case -1:    /* For fseek() error. */
        res = CURL_SEEKFUNC_CANTSEEK;
        break;
      default:
        res = CURL_SEEKFUNC_FAIL;
        break;
      }
    }
  }

  if(res == CURL_SEEKFUNC_OK)
    mimesetstate(&part->state, targetstate, NULL);

  return res;
}